

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest02ValidityPeriods_::
Section2Validpre2000UTCnotBeforeDateTest3<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section2Validpre2000UTCnotBeforeDateTest3
          (Section2Validpre2000UTCnotBeforeDateTest3<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest02ValidityPeriods,
                     Section2Validpre2000UTCnotBeforeDateTest3) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "GoodCACert",
                               "Validpre2000UTCnotBeforeDateTest3EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "GoodCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.2.3";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}